

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::ColorClearsTest::render
          (ColorClearsTest *this,Context *context,Surface *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  ulong uVar5;
  deUint32 dVar6;
  uint uVar7;
  uint uVar8;
  FboConfig *pFVar9;
  float *pfVar10;
  Vec4 VVar11;
  Vector<float,_3> local_214;
  Vector<float,_3> local_208;
  deUint32 local_1fc;
  undefined1 local_1f8 [4];
  deUint32 shaderID;
  SingleTex2DShader shader;
  undefined1 local_98 [8];
  Vec4 color;
  int cHeight;
  int cWidth;
  int cY;
  int cX;
  int i;
  undefined1 local_68 [8];
  Framebuffer fbo;
  deRandom rnd;
  int height;
  int width;
  Surface *dst_local;
  Context *context_local;
  ColorClearsTest *this_local;
  
  deRandom_init((deRandom *)&fbo.m_depthbuffer,0);
  pFVar9 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  Functional::Framebuffer::Framebuffer((Framebuffer *)local_68,context,pFVar9,0x80,0x80,0,0,0,0);
  Functional::Framebuffer::checkCompleteness((Framebuffer *)local_68);
  dVar6 = Functional::Framebuffer::getFramebuffer((Framebuffer *)local_68);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar6);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  (*context->_vptr_Context[0x33])(context,0xc11);
  for (cY = 0; cY < 0xf; cY = cY + 1) {
    dVar6 = deRandom_getUint32((deRandom *)&fbo.m_depthbuffer);
    uVar4 = (ulong)(dVar6 & 0x7fffffff) % 0x80;
    dVar6 = deRandom_getUint32((deRandom *)&fbo.m_depthbuffer);
    uVar5 = (ulong)(dVar6 & 0x7fffffff) % 0x80;
    dVar6 = deRandom_getUint32((deRandom *)&fbo.m_depthbuffer);
    color.m_data[3] = (float)((long)((ulong)dVar6 & 0xffffffff7fffffff) % (long)(0x80 - (int)uVar4))
    ;
    dVar6 = deRandom_getUint32((deRandom *)&fbo.m_depthbuffer);
    color.m_data[2] = (float)((long)((ulong)dVar6 & 0xffffffff7fffffff) % (long)(0x80 - (int)uVar5))
    ;
    dVar6 = deRandom_getUint32((deRandom *)&fbo.m_depthbuffer);
    tcu::RGBA::RGBA((RGBA *)&shader.super_ShaderProgram.field_0x154,dVar6);
    VVar11 = tcu::RGBA::toVec((RGBA *)local_98);
    (*context->_vptr_Context[0x32])
              (VVar11.m_data._0_8_,VVar11.m_data._8_8_,context,uVar4,uVar5,
               (ulong)(uint)color.m_data[3],(ulong)(uint)color.m_data[2]);
    pfVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_98);
    fVar1 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_98);
    fVar2 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_98);
    fVar3 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_98);
    (*context->_vptr_Context[0x2a])((ulong)(uint)fVar1,(ulong)(uint)fVar2,fVar3,*pfVar10);
    (*context->_vptr_Context[0x2d])(context,0x4000);
  }
  (*context->_vptr_Context[0x34])(context,0xc11);
  pFVar9 = Functional::Framebuffer::getConfig((Framebuffer *)local_68);
  if (pFVar9->colorbufferType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    SingleTex2DShader::SingleTex2DShader((SingleTex2DShader *)local_1f8);
    local_1fc = (*context->_vptr_Context[0x75])(context,local_1f8);
    SingleTex2DShader::setUnit((SingleTex2DShader *)local_1f8,context,local_1fc,0);
    dVar6 = Functional::Framebuffer::getColorbuffer((Framebuffer *)local_68);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar6);
    uVar7 = (*context->_vptr_Context[2])();
    uVar8 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar7,(ulong)uVar8);
    dVar6 = local_1fc;
    tcu::Vector<float,_3>::Vector(&local_208,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_214,1.0,1.0,0.0);
    sglr::drawQuad(context,dVar6,&local_208,&local_214);
    uVar7 = (*context->_vptr_Context[2])();
    uVar8 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uVar7,(ulong)uVar8);
    SingleTex2DShader::~SingleTex2DShader((SingleTex2DShader *)local_1f8);
  }
  else {
    (*context->_vptr_Context[0x80])(context,dst,0,0,0x80,0x80);
  }
  Functional::Framebuffer::~Framebuffer((Framebuffer *)local_68);
  return;
}

Assistant:

void ColorClearsTest::render (sglr::Context& context, Surface& dst)
{
	int			width	= 128;
	int			height	= 128;
	deRandom	rnd;

	deRandom_init(&rnd, 0);

	// Create framebuffer
	Framebuffer fbo(context, getConfig(), width, height);
	fbo.checkCompleteness();

	// Clear fbo
	context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	context.viewport(0, 0, width, height);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Enable scissor test.
	context.enable(GL_SCISSOR_TEST);

	// Do 10 random color clears
	for (int i = 0; i < 15; i++)
	{
		int		cX		= (int)(deRandom_getUint32(&rnd) & 0x7fffffff) % width;
		int		cY		= (int)(deRandom_getUint32(&rnd) & 0x7fffffff) % height;
		int		cWidth	= (int)(deRandom_getUint32(&rnd) & 0x7fffffff) % (width-cX);
		int		cHeight	= (int)(deRandom_getUint32(&rnd) & 0x7fffffff) % (height-cY);
		Vec4	color	= RGBA(deRandom_getUint32(&rnd)).toVec();

		context.scissor(cX, cY, cWidth, cHeight);
		context.clearColor(color.x(), color.y(), color.z(), color.w());
		context.clear(GL_COLOR_BUFFER_BIT);
	}

	// Disable scissor.
	context.disable(GL_SCISSOR_TEST);

	if (fbo.getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		// Unbind fbo
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);

		// Draw to screen
		SingleTex2DShader	shader;
		deUint32			shaderID = context.createProgram(&shader);

		shader.setUnit(context, shaderID, 0);

		context.bindTexture(GL_TEXTURE_2D, fbo.getColorbuffer());
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Read from screen
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
	{
		// Read from fbo
		context.readPixels(dst, 0, 0, width, height);
	}
}